

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O1

void __thiscall osMutex::osMutex(osMutex *this,char *name)

{
  long lVar1;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_1c;
  
  this->Name = name;
  lVar1 = 0;
  this->OwnerFile = (char *)0x0;
  this->OwnerThread = (osThread *)0x0;
  pthread_mutexattr_init(&local_1c);
  pthread_mutexattr_settype(&local_1c,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_1c);
  StaticInit();
  pthread_mutex_lock((pthread_mutex_t *)&MutexListMutex);
  do {
    if (*(long *)((long)MutexList + lVar1) == 0) {
      *(osMutex **)((long)MutexList + lVar1) = this;
      break;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x80);
  pthread_mutex_unlock((pthread_mutex_t *)&MutexListMutex);
  return;
}

Assistant:

osMutex::osMutex(const char* name)
    : Name(name)
    , OwnerFile(nullptr)
    , OwnerThread(nullptr)
{
#ifdef _WIN32
    Handle = CreateMutex(nullptr, false, name);
#elif __linux__
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&m_mutex, &attr);
#endif

    StaticInit();
    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        if (MutexList[i] == nullptr)
        {
            MutexList[i] = this;
            break;
        }
    }
    UnlockListMutex();
}